

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O0

Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> __thiscall
kj::
refcounted<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,kj::Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>>>
          (kj *this,Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_> *params)

{
  WebSocketResponseImpl *this_00;
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_> *other;
  WebSocketResponseImpl *extraout_RDX;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> OVar1;
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_> local_28;
  NoInfer<kj::Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_>_> *local_18;
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_> *params_local;
  
  local_18 = params;
  params_local = (Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_> *)this;
  this_00 = (WebSocketResponseImpl *)operator_new(0x38);
  other = fwd<kj::Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>>>(local_18);
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_>::Own(&local_28,other);
  anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::WebSocketResponseImpl
            (this_00,&local_28);
  Refcounted::addRefInternal<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>
            ((Refcounted *)this,this_00);
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

inline Own<T> refcounted(Params&&... params) {
  // Allocate a new refcounted instance of T, passing `params` to its constructor.  Returns an
  // initial reference to the object.  More references can be created with `kj::addRef()`.

  return Refcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}